

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.h
# Opt level: O2

void __thiscall spvtools::opt::LoopUtils::LoopUtils(LoopUtils *this,IRContext *context,Loop *loop)

{
  LoopDescriptor *pLVar1;
  
  this->context_ = context;
  pLVar1 = IRContext::GetLoopDescriptor(context,loop->loop_header_->function_);
  this->loop_desc_ = pLVar1;
  this->loop_ = loop;
  this->function_ = loop->loop_header_->function_;
  return;
}

Assistant:

LoopUtils(IRContext* context, Loop* loop)
      : context_(context),
        loop_desc_(
            context->GetLoopDescriptor(loop->GetHeaderBlock()->GetParent())),
        loop_(loop),
        function_(*loop_->GetHeaderBlock()->GetParent()) {}